

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

size_t __thiscall
duckdb::FSSTCompressionState::GetRequiredSize(FSSTCompressionState *this,size_t string_len)

{
  uint uVar1;
  bitpacking_width_t width;
  idx_t iVar2;
  
  if (this->max_compressed_string_length < string_len) {
    width = BitpackingPrimitives::MinimumBitWidth<unsigned_long,false>(string_len);
  }
  else {
    width = this->current_width;
  }
  uVar1 = (this->current_dictionary).size;
  iVar2 = BitpackingPrimitives::GetRequiredSize
                    (((long)(this->index_buffer).
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->index_buffer).
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) + 1,width);
  return this->fsst_serialized_symbol_table_size + string_len + uVar1 + iVar2 + 0x10;
}

Assistant:

size_t GetRequiredSize(size_t string_len) {
		bitpacking_width_t required_minimum_width;
		if (string_len > max_compressed_string_length) {
			required_minimum_width = BitpackingPrimitives::MinimumBitWidth(string_len);
		} else {
			required_minimum_width = current_width;
		}

		size_t current_dict_size = current_dictionary.size;
		idx_t current_string_count = index_buffer.size();

		size_t dict_offsets_size =
		    BitpackingPrimitives::GetRequiredSize(current_string_count + 1, required_minimum_width);

		// TODO switch to a symbol table per RowGroup, saves a bit of space
		return sizeof(fsst_compression_header_t) + current_dict_size + dict_offsets_size + string_len +
		       fsst_serialized_symbol_table_size;
	}